

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

Map<unsigned_long,_proto2_unittest::TestAllTypes> * __thiscall
google::protobuf::internal::TypeDefinedMapFieldBase<unsigned_long,_proto2_unittest::TestAllTypes>::
MutableMap(TypeDefinedMapFieldBase<unsigned_long,_proto2_unittest::TestAllTypes> *this)

{
  TypeDefinedMapFieldBase<unsigned_long,_proto2_unittest::TestAllTypes> *this_local;
  
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  MapFieldBase::SetMapDirty(&this->super_MapFieldBase);
  return (Map<unsigned_long,_proto2_unittest::TestAllTypes> *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }